

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  pointer ppVar6;
  ulong __n;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<std::pair<int,_double>_> __l_01;
  allocator_type local_91;
  vector<double,_std::allocator<double>_> test2;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> expectedZip;
  vector<int,_std::allocator<int>_> test1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> outputZip;
  
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x300000001;
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3200000022;
  __l._M_len = 4;
  __l._M_array = (iterator)&outputZip;
  std::vector<int,_std::allocator<int>_>::vector(&test1,__l,(allocator_type *)&test2);
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&outputZip;
  std::vector<double,_std::allocator<double>_>::vector(&test2,__l_00,(allocator_type *)&expectedZip)
  ;
  poVar3 = std::operator<<((ostream *)&std::cout,"Test zip...");
  std::endl<char,std::char_traits<char>>(poVar3);
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(outputZip.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  outputZip.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(outputZip.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,3);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&outputZip;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&expectedZip,__l_01,&local_91);
  uVar4 = (long)test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2;
  __n = (long)test2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)test2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (uVar4 <= __n) {
    __n = uVar4;
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&outputZip,__n,&local_91);
  lVar5 = 0;
  for (ppVar6 = outputZip.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 != outputZip.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
    dVar1 = *(double *)
             ((long)test2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5 * 4);
    ppVar6->first =
         *(int *)((long)test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar5 * 2);
    ppVar6->second = dVar1;
    lVar5 = lVar5 + 2;
  }
  bVar2 = std::operator==(&expectedZip,&outputZip);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&outputZip.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&expectedZip.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&test2.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&test1.super__Vector_base<int,_std::allocator<int>_>);
    return 0;
  }
  __assert_fail("expectedZip==outputZip",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/zip/main.cpp"
                ,0x18,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test1={1, 3, 34, 50};
  vector<double> test2={1.0, 2.0, 3.0};

  cout << "Test zip..." << endl;
  vector< pair<int,double> > expectedZip={
      make_pair(1,1.0),
      make_pair(3,2.0),
      make_pair(34, 3.0)      
  };
  auto outputZip = Functional::zip(test1, test2);  
  assert( expectedZip==outputZip);
  cout << "passed!" << endl;

  return 0;

}